

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O0

idx_t duckdb::TernaryExecutor::
      SelectLoop<duckdb::uhugeint_t,_duckdb::uhugeint_t,_duckdb::uhugeint_t,_duckdb::UpperInclusiveBetweenOperator,_false,_true,_false>
                (uhugeint_t *adata,uhugeint_t *bdata,uhugeint_t *cdata,SelectionVector *result_sel,
                idx_t count,SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
                ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  uhugeint_t upper;
  uhugeint_t lower;
  uhugeint_t input;
  bool bVar1;
  idx_t iVar2;
  idx_t iVar3;
  idx_t iVar4;
  uint64_t *puVar5;
  uint64_t *puVar6;
  SelectionVector *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  ulong in_R8;
  SelectionVector *in_R9;
  SelectionVector *in_stack_00000008;
  SelectionVector *in_stack_00000010;
  bool comparison_result;
  idx_t cidx;
  idx_t bidx;
  idx_t aidx;
  idx_t result_idx;
  idx_t i;
  idx_t false_count;
  idx_t true_count;
  uint7 in_stack_ffffffffffffff58;
  bool bVar7;
  uint64_t in_stack_ffffffffffffff60;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff68;
  SelectionVector *in_stack_ffffffffffffff70;
  ulong local_48;
  idx_t local_38;
  
  local_38 = 0;
  for (local_48 = 0; local_48 < in_R8; local_48 = local_48 + 1) {
    SelectionVector::get_index(in_RCX,local_48);
    iVar2 = SelectionVector::get_index(in_R9,local_48);
    iVar3 = SelectionVector::get_index(in_stack_00000008,local_48);
    iVar4 = SelectionVector::get_index(in_stack_00000010,local_48);
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    bVar7 = false;
    if (bVar1) {
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      bVar7 = false;
      if (bVar1) {
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
        bVar7 = false;
        if (bVar1) {
          puVar5 = (uint64_t *)(in_RSI + iVar3 * 0x10);
          in_stack_ffffffffffffff70 = (SelectionVector *)*puVar5;
          puVar6 = (uint64_t *)(in_RDX + iVar4 * 0x10);
          in_stack_ffffffffffffff60 = *puVar6;
          in_stack_ffffffffffffff68 = (TemplatedValidityMask<unsigned_long> *)puVar6[1];
          input.upper = *(uint64_t *)(in_RDI + iVar2 * 0x10);
          input.lower = puVar5[1];
          lower.upper = (uint64_t)in_stack_ffffffffffffff70;
          lower.lower = (uint64_t)in_stack_ffffffffffffff68;
          upper.upper = in_stack_ffffffffffffff60;
          upper.lower = (ulong)in_stack_ffffffffffffff58;
          bVar7 = UpperInclusiveBetweenOperator::Operation<duckdb::uhugeint_t>(input,lower,upper);
        }
      }
    }
    SelectionVector::set_index
              (in_stack_ffffffffffffff70,(idx_t)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60)
    ;
    local_38 = bVar7 + local_38;
  }
  return local_38;
}

Assistant:

static inline idx_t SelectLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, const SelectionVector *result_sel, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = result_sel->get_index(i);
			auto aidx = asel.get_index(i);
			auto bidx = bsel.get_index(i);
			auto cidx = csel.get_index(i);
			bool comparison_result =
			    (NO_NULL || (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx))) &&
			    OP::Operation(adata[aidx], bdata[bidx], cdata[cidx]);
			if (HAS_TRUE_SEL) {
				true_sel->set_index(true_count, result_idx);
				true_count += comparison_result;
			}
			if (HAS_FALSE_SEL) {
				false_sel->set_index(false_count, result_idx);
				false_count += !comparison_result;
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}